

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O1

void __thiscall
t_go_generator::generate_go_struct_initializer
          (t_go_generator *this,ostream *out,t_struct *tstruct,bool is_args_or_result)

{
  pointer pptVar1;
  t_field *tfield;
  bool optional_field;
  bool bVar2;
  ostream *poVar3;
  pointer pptVar4;
  string publicized_name;
  t_const_value *def_value;
  string local_a0;
  ostream *local_80;
  string local_78;
  t_const_value *local_58;
  string local_50;
  
  type_name_abi_cxx11_(&local_78,this,&tstruct->super_t_type);
  publicize(&local_a0,this,&local_78,is_args_or_result,&(this->super_t_generator).service_name_);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  local_80 = out;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  pptVar1 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; poVar3 = local_80, pptVar4 != pptVar1;
      pptVar4 = pptVar4 + 1) {
    tfield = *pptVar4;
    optional_field = is_pointer_field(tfield,false);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    get_publicized_name_and_def_value(this,tfield,&local_a0,&local_58);
    if (local_58 != (t_const_value *)0x0 && !optional_field) {
      bVar2 = omit_initialization(tfield);
      if (!bVar2) {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_80,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_78,&this->super_t_generator);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_78._M_dataplus._M_p,local_78._M_string_length);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_a0._M_dataplus._M_p,local_a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
        render_field_initial_value(&local_50,this,tfield,&tfield->name_,optional_field);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_80,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_go_generator::generate_go_struct_initializer(ostream& out,
                                                    t_struct* tstruct,
                                                    bool is_args_or_result) {
  out << publicize(type_name(tstruct), is_args_or_result) << "{";
  const vector<t_field*>& members = tstruct->get_members();
  for (auto member : members) {
    bool pointer_field = is_pointer_field(member);
    string publicized_name;
    t_const_value* def_value;
    get_publicized_name_and_def_value(member, &publicized_name, &def_value);
    if (!pointer_field && def_value != nullptr && !omit_initialization(member)) {
      out << endl << indent() << publicized_name << ": "
          << render_field_initial_value(member, member->get_name(), pointer_field) << ","
          << endl;
    }
  }

  out << "}" << endl;
}